

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O0

void fiat_cmovznz_u64(uint64_t *out1,fiat_uint1 arg1,uint64_t arg2,uint64_t arg3)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t x3;
  uint64_t x2;
  fiat_uint1 x1;
  uint64_t arg3_local;
  uint64_t arg2_local;
  fiat_uint1 arg1_local;
  uint64_t *out1_local;
  
  uVar1 = fiat_value_barrier_u64((long)-(arg1 != '\0'));
  uVar2 = fiat_value_barrier_u64((long)-(arg1 != '\0') ^ 0xffffffffffffffff);
  *out1 = uVar1 & arg3 | uVar2 & arg2;
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
static inline void fiat_cmovznz_u64(uint64_t* out1, fiat_uint1 arg1, uint64_t arg2, uint64_t arg3) {
  fiat_uint1 x1;
  uint64_t x2;
  uint64_t x3;
  x1 = (!(!arg1));
  x2 = ((fiat_int1)(0x0 - x1) & UINT64_C(0xffffffffffffffff));
  x3 = ((fiat_value_barrier_u64(x2) & arg3) | (fiat_value_barrier_u64((~x2)) & arg2));
  *out1 = x3;
}